

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread-workload-benchmark.cpp
# Opt level: O1

void workload_unrollaccum8(vector<float,_std::allocator<float>_> *data,float *result)

{
  pointer pfVar1;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  undefined8 uVar5;
  long lVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  lVar3 = std::chrono::_V2::system_clock::now();
  if ((*(int *)&(data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish -
       *(int *)&(data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_start & 0x1cU) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ERROR in ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"workload_unrollaccum8",0x15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,": data.size ",0xc);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  }
  pfVar1 = (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  lVar6 = (long)(data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pfVar1;
  if (lVar6 == 0) {
    fVar8 = 0.0;
  }
  else {
    fVar8 = 0.0;
    uVar7 = 0;
    fVar10 = 0.0;
    fVar11 = 0.0;
    fVar12 = 0.0;
    fVar13 = 0.0;
    fVar14 = 0.0;
    fVar15 = 0.0;
    fVar9 = 0.0;
    do {
      fVar9 = fVar9 + pfVar1[uVar7];
      fVar15 = fVar15 + pfVar1[uVar7 + 1];
      fVar14 = fVar14 + pfVar1[uVar7 + 2];
      fVar13 = fVar13 + pfVar1[uVar7 + 3];
      fVar12 = fVar12 + pfVar1[uVar7 + 4];
      fVar11 = fVar11 + pfVar1[uVar7 + 5];
      fVar10 = fVar10 + pfVar1[uVar7 + 6];
      fVar8 = fVar8 + pfVar1[uVar7 + 7];
      uVar7 = uVar7 + 8;
    } while (uVar7 < (ulong)(lVar6 >> 2));
    fVar8 = fVar9 + fVar15 + fVar14 + fVar13 + fVar12 + fVar11 + fVar10 + fVar8;
  }
  *result = fVar8;
  lVar6 = std::chrono::_V2::system_clock::now();
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&iomutex);
  if (iVar2 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"workload_unrollaccum8",0x15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," [cpu ",6);
    iVar2 = sched_getcpu();
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]:\n",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  processed items: ",0x13);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  elapsed: ",0xb);
    poVar4 = std::ostream::_M_insert<double>((double)(lVar6 - lVar3) / 1000000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ms\n",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  result: ",10);
    poVar4 = std::ostream::_M_insert<double>((double)*result);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    pthread_mutex_unlock((pthread_mutex_t *)&iomutex);
    return;
  }
  uVar5 = std::__throw_system_error(iVar2);
  pthread_mutex_unlock((pthread_mutex_t *)&iomutex);
  _Unwind_Resume(uVar5);
}

Assistant:

void workload_unrollaccum8(const std::vector<float>& data, float& result) {
  auto t1 = hires_clock::now();
  if (data.size() % 8 != 0) {
    std::cerr
        << "ERROR in " << __func__ << ": data.size " << data.size() << "\n";
  }
  float rt0 = 0;
  float rt1 = 0;
  float rt2 = 0;
  float rt3 = 0;
  float rt4 = 0;
  float rt5 = 0;
  float rt6 = 0;
  float rt7 = 0;
  for (size_t i = 0; i < data.size(); i += 8) {
    rt0 += data[i];
    rt1 += data[i + 1];
    rt2 += data[i + 2];
    rt3 += data[i + 3];
    rt4 += data[i + 4];
    rt5 += data[i + 5];
    rt6 += data[i + 6];
    rt7 += data[i + 7];
  }
  result = rt0 + rt1 + rt2 + rt3 + rt4 + rt5 + rt6 + rt7;

  {
    auto t2 = hires_clock::now();
    std::lock_guard<std::mutex> iolock(iomutex);
    std::cout << __func__ << " [cpu " << sched_getcpu() << "]:\n";
    std::cout << "  processed items: " << data.size() << "\n";
    std::cout << "  elapsed: " << duration_ms(t2 - t1).count() << " ms\n";
    std::cout << "  result: " << result << "\n";
  }
}